

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Test_output.cpp
# Opt level: O1

void __thiscall
Contact::Contact(Contact *this,string *last_name,string *first_name,string *tel_num,string *email)

{
  pointer pcVar1;
  
  (this->last_name)._M_dataplus._M_p = (pointer)&(this->last_name).field_2;
  pcVar1 = (last_name->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)this,pcVar1,pcVar1 + last_name->_M_string_length);
  (this->first_name)._M_dataplus._M_p = (pointer)&(this->first_name).field_2;
  pcVar1 = (first_name->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->first_name,pcVar1,pcVar1 + first_name->_M_string_length);
  (this->tel_num)._M_dataplus._M_p = (pointer)&(this->tel_num).field_2;
  pcVar1 = (tel_num->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->tel_num,pcVar1,pcVar1 + tel_num->_M_string_length);
  (this->email)._M_dataplus._M_p = (pointer)&(this->email).field_2;
  pcVar1 = (email->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->email,pcVar1,pcVar1 + email->_M_string_length);
  return;
}

Assistant:

Contact(const std::string& last_name,
		const std::string& first_name,
		const std::string& tel_num,
		const std::string& email)
		: last_name{last_name},
		first_name{first_name},
		tel_num{tel_num},
		email{email} {}